

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> __thiscall
wallet::MakeWalletDatabase
          (wallet *this,string *name,DatabaseOptions *options,DatabaseStatus *status,
          bilingual_str *error_string)

{
  T *path;
  long in_FS_OFFSET;
  bilingual_str local_b8;
  _Variant_storage<false,_bilingual_str,_fs::path> local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GetWalletPath((Result<fs::path> *)&local_78,name);
  if (local_78._M_index == '\x01') {
    path = util::Result<fs::path>::value((Result<fs::path> *)&local_78);
    MakeDatabase(this,path,options,status,error_string);
  }
  else {
    util::ErrorString<fs::path>(&local_b8,(Result<fs::path> *)&local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error_string->original,&local_b8.original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error_string->translated,&local_b8.translated);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.translated._M_dataplus._M_p != &local_b8.translated.field_2) {
      operator_delete(local_b8.translated._M_dataplus._M_p,
                      local_b8.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.original._M_dataplus._M_p != &local_b8.original.field_2) {
      operator_delete(local_b8.original._M_dataplus._M_p,
                      local_b8.original.field_2._M_allocated_capacity + 1);
    }
    *status = FAILED_BAD_PATH;
    *(undefined8 *)this = 0;
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_fs::path>::~_Variant_storage
            (&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
            )(__uniq_ptr_data<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<WalletDatabase> MakeWalletDatabase(const std::string& name, const DatabaseOptions& options, DatabaseStatus& status, bilingual_str& error_string)
{
    const auto& wallet_path = GetWalletPath(name);
    if (!wallet_path) {
        error_string = util::ErrorString(wallet_path);
        status = DatabaseStatus::FAILED_BAD_PATH;
        return nullptr;
    }
    return MakeDatabase(*wallet_path, options, status, error_string);
}